

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * cuddCProjectionRecur(DdManager *dd,DdNode *R,DdNode *Y,DdNode *Ysupp)

{
  int *piVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  ulong uVar5;
  uint uVar6;
  DdNode *pDVar7;
  DdNode *R_00;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  DdNode *Y_00;
  DdNode *pDVar11;
  DdNode *local_60;
  DdNode *local_58;
  
  pDVar4 = dd->one;
  if (pDVar4 == Y) {
    return R;
  }
  pDVar11 = (DdNode *)((ulong)Y & 0xfffffffffffffffe);
  if (pDVar11->index == 0x7fffffff) {
    __assert_fail("!Cudd_IsConstant(Y)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                  ,0x5a0,"DdNode *cuddCProjectionRecur(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  pDVar7 = (DdNode *)((ulong)pDVar4 ^ 1);
  if (pDVar7 == R) {
    return R;
  }
  pDVar3 = cuddCacheLookup2(dd,Cudd_CProjection,R,Y);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  pDVar3 = (DdNode *)((ulong)R & 0xfffffffffffffffe);
  uVar2 = pDVar3->index;
  uVar6 = 0x7fffffff;
  uVar8 = 0x7fffffff;
  if ((ulong)uVar2 != 0x7fffffff) {
    uVar8 = dd->perm[uVar2];
  }
  uVar9 = (ulong)pDVar11->index;
  if (uVar9 != 0x7fffffff) {
    uVar6 = dd->perm[uVar9];
  }
  uVar10 = 0;
  local_60 = R;
  R_00 = R;
  if (uVar8 <= uVar6) {
    local_60 = (pDVar3->type).kids.T;
    R_00 = (pDVar3->type).kids.E;
    if (pDVar3 != R) {
      local_60 = (DdNode *)((ulong)local_60 ^ 1);
      R_00 = (DdNode *)((ulong)R_00 ^ 1);
    }
    uVar10 = (ulong)uVar2;
  }
  if (uVar8 < uVar6) {
    pDVar4 = cuddCProjectionRecur(dd,local_60,Y,Ysupp);
    if (pDVar4 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    uVar5 = (ulong)pDVar4 & 0xfffffffffffffffe;
    *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
    pDVar11 = cuddCProjectionRecur(dd,R_00,Y,Ysupp);
    if (pDVar11 == (DdNode *)0x0) goto LAB_007da779;
    uVar9 = (ulong)pDVar11 & 0xfffffffffffffffe;
    *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
    pDVar7 = cuddBddIteRecur(dd,dd->vars[uVar10],pDVar4,pDVar11);
    if (pDVar7 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar4 = pDVar11;
      goto LAB_007da779;
    }
LAB_007da501:
    *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + -1;
  }
  else {
    pDVar3 = (pDVar11->type).kids.T;
    Y_00 = (DdNode *)((ulong)pDVar3 ^ 1);
    if (pDVar11 == Y) {
      Y_00 = pDVar3;
    }
    if (Y_00 == pDVar7) {
      pDVar3 = (pDVar11->type).kids.E;
      Y_00 = (DdNode *)((ulong)pDVar3 ^ 1);
      if (pDVar11 == Y) {
        Y_00 = pDVar3;
      }
      local_58 = (DdNode *)((ulong)dd->vars[uVar9] ^ 1);
      pDVar11 = R_00;
    }
    else {
      local_58 = dd->vars[uVar9];
      pDVar11 = local_60;
      local_60 = R_00;
    }
    pDVar3 = cuddBddExistAbstractRecur(dd,pDVar11,(Ysupp->type).kids.T);
    if (pDVar3 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    if (pDVar3 == pDVar4) {
      pDVar4 = cuddCProjectionRecur(dd,pDVar11,Y_00,(Ysupp->type).kids.T);
      if (pDVar4 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      uVar9 = (ulong)pDVar4 & 0xfffffffffffffffe;
      *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
    }
    else {
      if (pDVar3 != pDVar7) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar7 = cuddCProjectionRecur(dd,local_60,Y_00,(Ysupp->type).kids.T);
        pDVar4 = pDVar3;
        if (pDVar7 == (DdNode *)0x0) goto LAB_007da779;
        piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar3 ^ 1),pDVar7);
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          pDVar4 = pDVar7;
          goto LAB_007da779;
        }
        uVar9 = (ulong)pDVar4 & 0xfffffffffffffffe;
        *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
        Cudd_RecursiveDeref(dd,pDVar3);
        Cudd_RecursiveDeref(dd,pDVar7);
        pDVar11 = cuddCProjectionRecur(dd,pDVar11,Y_00,(Ysupp->type).kids.T);
        if (pDVar11 == (DdNode *)0x0) goto LAB_007da779;
        uVar5 = (ulong)pDVar11 & 0xfffffffffffffffe;
        *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
        pDVar7 = cuddBddIteRecur(dd,local_58,pDVar11,pDVar4);
        if (pDVar7 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar11);
          goto LAB_007da779;
        }
        goto LAB_007da501;
      }
      pDVar4 = cuddCProjectionRecur(dd,local_60,Y_00,(Ysupp->type).kids.T);
      if (pDVar4 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      uVar9 = (ulong)pDVar4 & 0xfffffffffffffffe;
      *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
      local_58 = (DdNode *)((ulong)local_58 ^ 1);
    }
    pDVar7 = cuddBddAndRecur(dd,local_58,pDVar4);
    if (pDVar7 == (DdNode *)0x0) {
LAB_007da779:
      Cudd_RecursiveDeref(dd,pDVar4);
      return (DdNode *)0x0;
    }
  }
  *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + -1;
  cuddCacheInsert2(dd,Cudd_CProjection,R,Y,pDVar7);
  return pDVar7;
}

Assistant:

DdNode *
cuddCProjectionRecur(
  DdManager * dd,
  DdNode * R,
  DdNode * Y,
  DdNode * Ysupp)
{
    DdNode *res, *res1, *res2, *resA;
    DdNode *r, *y, *RT, *RE, *YT, *YE, *Yrest, *Ra, *Ran, *Gamma, *Alpha;
    unsigned int topR, topY, top, index = 0;
    DdNode *one = DD_ONE(dd);

    statLine(dd);
    if (Y == one) return(R);

#ifdef DD_DEBUG
    assert(!Cudd_IsConstant(Y));
#endif

    if (R == Cudd_Not(one)) return(R);

    res = cuddCacheLookup2(dd, Cudd_CProjection, R, Y);
    if (res != NULL) return(res);

    r = Cudd_Regular(R);
    topR = cuddI(dd,r->index);
    y = Cudd_Regular(Y);
    topY = cuddI(dd,y->index);

    top = ddMin(topR, topY);

    /* Compute the cofactors of R */
    if (topR == top) {
        index = r->index;
        RT = cuddT(r);
        RE = cuddE(r);
        if (r != R) {
            RT = Cudd_Not(RT); RE = Cudd_Not(RE);
        }
    } else {
        RT = RE = R;
    }

    if (topY > top) {
        /* Y does not depend on the current top variable.
        ** We just need to compute the results on the two cofactors of R
        ** and make them the children of a node labeled r->index.
        */
        res1 = cuddCProjectionRecur(dd,RT,Y,Ysupp);
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddCProjectionRecur(dd,RE,Y,Ysupp);
        if (res2 == NULL) {
            Cudd_RecursiveDeref(dd,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = cuddBddIteRecur(dd, dd->vars[index], res1, res2);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd,res1);
            Cudd_RecursiveDeref(dd,res2);
            return(NULL);
        }
        /* If we have reached this point, res1 and res2 are now
        ** incorporated in res. cuddDeref is therefore sufficient.
        */
        cuddDeref(res1);
        cuddDeref(res2);
    } else {
        /* Compute the cofactors of Y */
        index = y->index;
        YT = cuddT(y);
        YE = cuddE(y);
        if (y != Y) {
            YT = Cudd_Not(YT); YE = Cudd_Not(YE);
        }
        if (YT == Cudd_Not(one)) {
            Alpha  = Cudd_Not(dd->vars[index]);
            Yrest = YE;
            Ra = RE;
            Ran = RT;
        } else {
            Alpha = dd->vars[index];
            Yrest = YT;
            Ra = RT;
            Ran = RE;
        }
        Gamma = cuddBddExistAbstractRecur(dd,Ra,cuddT(Ysupp));
        if (Gamma == NULL) return(NULL);
        if (Gamma == one) {
            res1 = cuddCProjectionRecur(dd,Ra,Yrest,cuddT(Ysupp));
            if (res1 == NULL) return(NULL);
            cuddRef(res1);
            res = cuddBddAndRecur(dd, Alpha, res1);
            if (res == NULL) {
                Cudd_RecursiveDeref(dd,res1);
                return(NULL);
            }
            cuddDeref(res1);
        } else if (Gamma == Cudd_Not(one)) {
            res1 = cuddCProjectionRecur(dd,Ran,Yrest,cuddT(Ysupp));
            if (res1 == NULL) return(NULL);
            cuddRef(res1);
            res = cuddBddAndRecur(dd, Cudd_Not(Alpha), res1);
            if (res == NULL) {
                Cudd_RecursiveDeref(dd,res1);
                return(NULL);
            }
            cuddDeref(res1);
        } else {
            cuddRef(Gamma);
            resA = cuddCProjectionRecur(dd,Ran,Yrest,cuddT(Ysupp));
            if (resA == NULL) {
                Cudd_RecursiveDeref(dd,Gamma);
                return(NULL);
            }
            cuddRef(resA);
            res2 = cuddBddAndRecur(dd, Cudd_Not(Gamma), resA);
            if (res2 == NULL) {
                Cudd_RecursiveDeref(dd,Gamma);
                Cudd_RecursiveDeref(dd,resA);
                return(NULL);
            }
            cuddRef(res2);
            Cudd_RecursiveDeref(dd,Gamma);
            Cudd_RecursiveDeref(dd,resA);
            res1 = cuddCProjectionRecur(dd,Ra,Yrest,cuddT(Ysupp));
            if (res1 == NULL) {
                Cudd_RecursiveDeref(dd,res2);
                return(NULL);
            }
            cuddRef(res1);
            res = cuddBddIteRecur(dd, Alpha, res1, res2);
            if (res == NULL) {
                Cudd_RecursiveDeref(dd,res1);
                Cudd_RecursiveDeref(dd,res2);
                return(NULL);
            }
            cuddDeref(res1);
            cuddDeref(res2);
        }
    }

    cuddCacheInsert2(dd,Cudd_CProjection,R,Y,res);

    return(res);

}